

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGen::Tools_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,bool moc,bool uic,bool rcc)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  char **ppcVar4;
  bool bVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> lst;
  char *local_88 [6];
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  ppcVar4 = local_88;
  local_88[4] = (char *)0x0;
  local_88[5] = (char *)0x0;
  local_88[2] = (char *)0x0;
  local_88[3] = (char *)0x0;
  local_88[0] = (char *)0x0;
  local_88[1] = (char *)0x0;
  bVar5 = (int)this != 0;
  if (bVar5) {
    ppcVar4 = local_88 + 2;
    local_88[0] = (char *)0x7;
    local_88[1] = "AUTOMOC";
  }
  uVar1 = (uint)bVar5;
  if (moc) {
    uVar1 = uVar1 + 1;
    *ppcVar4 = (char *)0x7;
    ppcVar4[1] = "AUTOUIC";
  }
  uVar2 = uVar1;
  if (uic) {
    uVar2 = uVar1 + 1;
    *(undefined8 *)((long)local_88 + (ulong)(uVar1 << 4)) = 7;
    *(char **)((long)local_88 + (ulong)(uVar1 << 4) + 8) = "AUTORCC";
  }
  if (uVar2 == 3) {
    local_48 = 2;
    local_40 = ", ";
    local_28 = 5;
    local_20 = " and ";
    local_18 = local_88[4];
    uStack_10 = local_88[5];
    sVar3 = 5;
  }
  else {
    if (uVar2 != 2) {
      if (uVar2 == 1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,local_88[1],local_88[1] + (long)local_88[0]);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    local_48 = 5;
    local_40 = " and ";
    sVar3 = 3;
  }
  uStack_30 = local_88[3];
  local_38 = local_88[2];
  local_58._M_str = local_88[1];
  local_58._M_len = (size_t)local_88[0];
  views._M_array = &local_58;
  views._M_len = sVar3;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Tools(bool moc, bool uic, bool rcc)
{
  std::array<cm::string_view, 3> lst;
  decltype(lst)::size_type num = 0;
  if (moc) {
    lst.at(num++) = "AUTOMOC";
  }
  if (uic) {
    lst.at(num++) = "AUTOUIC";
  }
  if (rcc) {
    lst.at(num++) = "AUTORCC";
  }
  switch (num) {
    case 1:
      return std::string(lst[0]);
    case 2:
      return cmStrCat(lst[0], " and ", lst[1]);
    case 3:
      return cmStrCat(lst[0], ", ", lst[1], " and ", lst[2]);
    default:
      break;
  }
  return std::string();
}